

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O2

void node::fav_child_processing_order<node::TreeIndexJSON>
               (TreeIndexJSON *ti,int *postorder,int *favorder)

{
  int iVar1;
  pointer pvVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar4 = *postorder;
  pvVar2 = (ti->super_PostLToChildren).postl_to_children_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)((long)&pvVar2[iVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8)
      != *(pointer *)&pvVar2[iVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl) {
    fav_child_processing_order<node::TreeIndexJSON>
              (ti,(ti->super_PostLToFavChild).postl_to_fav_child_.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + iVar4,favorder);
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      iVar4 = *postorder;
      pvVar2 = (ti->super_PostLToChildren).postl_to_children_.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = *(long *)&pvVar2[iVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if ((ulong)((long)*(pointer *)
                         ((long)&pvVar2[iVar4].super__Vector_base<int,_std::allocator<int>_>._M_impl
                         + 8) - lVar3 >> 2) <= uVar6) break;
      if (*(int *)(lVar3 + uVar6 * 4) !=
          (ti->super_PostLToFavChild).postl_to_fav_child_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [iVar4]) {
        fav_child_processing_order<node::TreeIndexJSON>(ti,(int *)(lVar3 + uVar6 * 4),favorder);
      }
      uVar5 = uVar5 + 1;
    }
  }
  iVar1 = *favorder;
  *favorder = iVar1 + 1;
  (ti->super_PostLToFavorableChildOrder).postl_to_favorder_.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[iVar1] =
       iVar4;
  return;
}

Assistant:

void fav_child_processing_order(TreeIndex& ti, int& postorder, int& favorder) {
  // Perform recursively for children.
  if (ti.postl_to_children_[postorder].size() != 0) {
    // First process the favorable child.
    fav_child_processing_order(ti, ti.postl_to_fav_child_[postorder], favorder);
    // Next, process all other children.
    for (unsigned int t = 0; t < ti.postl_to_children_[postorder].size(); ++t) {
      // Favorable child was processed before.
      if (ti.postl_to_children_[postorder][t] == ti.postl_to_fav_child_[postorder]) {
        continue;
      }
      // Process other children in left to right order.
      fav_child_processing_order(ti, ti.postl_to_children_[postorder][t], favorder);
    }
  }
  // Assign favorder to postorder.
  ti.postl_to_favorder_[favorder++] = postorder;
}